

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

SRes crnlib::MyRead(void *pp,void *data,size_t *size)

{
  CSeqInStreamBuf *p;
  size_t curSize;
  size_t *size_local;
  void *data_local;
  void *pp_local;
  
  p = (CSeqInStreamBuf *)*size;
  if (*(CSeqInStreamBuf **)((long)pp + 0x10) < p) {
    p = *(CSeqInStreamBuf **)((long)pp + 0x10);
  }
  memcpy(data,*(void **)((long)pp + 8),(size_t)p);
  *(long *)((long)pp + 0x10) = *(long *)((long)pp + 0x10) - (long)p;
  *(long *)((long)pp + 8) = (long)&(p->funcTable).Read + *(long *)((long)pp + 8);
  *size = (size_t)p;
  return 0;
}

Assistant:

static SRes MyRead(void* pp, void* data, size_t* size) {
  size_t curSize = *size;
  CSeqInStreamBuf* p = (CSeqInStreamBuf*)pp;
  if (p->rem < curSize)
    curSize = p->rem;
  memcpy(data, p->data, curSize);
  p->rem -= curSize;
  p->data += curSize;
  *size = curSize;
  return SZ_OK;
}